

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
WrappedBytes::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (WrappedBytes *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_58;
  
  std::__cxx11::string::string((string *)&local_78,"bytes",&local_99);
  std::__cxx11::string::string((string *)&local_98,"",&local_9a);
  hiberlite::sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::sql_nvp
            (&local_58,&local_78,&this->bytes,&local_98);
  hiberlite::AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_58);
  hiberlite::sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~sql_nvp
            (&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
  	  ar & HIBERLITE_NVP(bytes);
	}